

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseTitle(TidyDocImpl *doc,Node *title,GetTokenMode mode)

{
  Node *pNVar1;
  Bool BVar2;
  Node *node;
  Node **ppNVar3;
  
LAB_0012beac:
  while( true ) {
    node = prvTidyGetToken(doc,MixedContent);
    if (node == (Node *)0x0) {
      prvTidyReportError(doc,title,(Node *)0x0,0xce);
      return;
    }
    if (node->tag != title->tag) break;
    if (node->type != StartTag) {
      if (node->type == EndTag) {
        prvTidyFreeNode(doc,node);
        title->closed = yes;
        goto LAB_0012bfe1;
      }
      break;
    }
    if (*(int *)((doc->config).value + 0x15) == 0) break;
    prvTidyReportError(doc,title,node,0xe0);
    node->type = EndTag;
    prvTidyUngetToken(doc);
  }
  BVar2 = prvTidynodeIsText(node);
  if (BVar2 == no) {
    BVar2 = InsertMisc(title,node);
    if (BVar2 != no) goto LAB_0012beac;
    if (node->tag != (Dict *)0x0) {
      prvTidyReportError(doc,title,node,0xcf);
      prvTidyUngetToken(doc);
LAB_0012bfe1:
      TrimSpaces(doc,title);
      return;
    }
    prvTidyReportError(doc,title,node,0xd0);
  }
  else {
    if (title->content == (Node *)0x0) {
      TrimInitialSpace(doc,title,node);
    }
    if (node->start < node->end) {
      node->parent = title;
      pNVar1 = title->last;
      node->prev = pNVar1;
      ppNVar3 = &pNVar1->next;
      if (pNVar1 == (Node *)0x0) {
        ppNVar3 = &title->content;
      }
      *ppNVar3 = node;
      title->last = node;
      goto LAB_0012beac;
    }
  }
  prvTidyFreeNode(doc,node);
  goto LAB_0012beac;
}

Assistant:

void TY_(ParseTitle)(TidyDocImpl* doc, Node *title, GetTokenMode ARG_UNUSED(mode))
{
    Node *node;
    while ((node = TY_(GetToken)(doc, MixedContent)) != NULL)
    {
        if (node->tag == title->tag && node->type == StartTag
            && cfgBool(doc, TidyCoerceEndTags) )
        {
            TY_(ReportError)(doc, title, node, COERCE_TO_ENDTAG);
            node->type = EndTag;
            TY_(UngetToken)( doc );
            continue;
        }
        else if (node->tag == title->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            title->closed = yes;
            TrimSpaces(doc, title);
            return;
        }

        if (TY_(nodeIsText)(node))
        {
            /* only called for 1st child */
            if (title->content == NULL)
                TrimInitialSpace(doc, title, node);

            if (node->start >= node->end)
            {
                TY_(FreeNode)( doc, node);
                continue;
            }

            TY_(InsertNodeAtEnd)(title, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(title, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(ReportError)(doc, title, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* pushback unexpected tokens */
        TY_(ReportError)(doc, title, node, MISSING_ENDTAG_BEFORE);
        TY_(UngetToken)( doc );
        TrimSpaces(doc, title);
        return;
    }

    TY_(ReportError)(doc, title, node, MISSING_ENDTAG_FOR);
}